

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O0

int amqpvalue_get_attach(AMQP_VALUE value,ATTACH_HANDLE *attach_handle)

{
  int iVar1;
  AMQP_TYPE AVar2;
  AMQP_VALUE pAVar3;
  AMQP_VALUE local_90;
  fields properties;
  AMQP_VALUE desired_capabilities_array;
  char *desired_capabilities;
  AMQP_VALUE offered_capabilities_array;
  char *offered_capabilities;
  uint64_t max_message_size;
  sequence_no initial_delivery_count;
  _Bool incomplete_unsettled;
  AMQP_VALUE unsettled;
  receiver_settle_mode rcv_settle_mode;
  sender_settle_mode snd_settle_mode;
  role role;
  handle handle;
  char *name;
  AMQP_VALUE item_value;
  AMQP_VALUE pAStack_30;
  uint32_t list_item_count;
  AMQP_VALUE list_value;
  ATTACH_INSTANCE *attach_instance;
  ATTACH_HANDLE *ppAStack_18;
  int result;
  ATTACH_HANDLE *attach_handle_local;
  AMQP_VALUE value_local;
  
  ppAStack_18 = attach_handle;
  attach_handle_local = (ATTACH_HANDLE *)value;
  list_value = (AMQP_VALUE)attach_create_internal();
  *ppAStack_18 = (ATTACH_HANDLE)list_value;
  if (*ppAStack_18 == (ATTACH_HANDLE)0x0) {
    attach_instance._4_4_ = 0xdef;
  }
  else {
    pAStack_30 = amqpvalue_get_inplace_described_value((AMQP_VALUE)attach_handle_local);
    if (pAStack_30 == (AMQP_VALUE)0x0) {
      attach_destroy(*ppAStack_18);
      attach_instance._4_4_ = 0xdf7;
    }
    else {
      iVar1 = amqpvalue_get_list_item_count(pAStack_30,(uint32_t *)((long)&item_value + 4));
      if (iVar1 == 0) {
        if (item_value._4_4_ == 0) {
          attach_instance._4_4_ = 0xe2b;
        }
        else {
          name = (char *)amqpvalue_get_list_item(pAStack_30,0);
          if ((AMQP_VALUE)name == (AMQP_VALUE)0x0) {
            attach_destroy(*ppAStack_18);
            attach_instance._4_4_ = 0xe0d;
          }
          else {
            AVar2 = amqpvalue_get_type((AMQP_VALUE)name);
            if (AVar2 == AMQP_TYPE_NULL) {
              amqpvalue_destroy((AMQP_VALUE)name);
              attach_destroy(*ppAStack_18);
              attach_instance._4_4_ = 0xe17;
            }
            else {
              iVar1 = amqpvalue_get_string((AMQP_VALUE)name,(char **)&stack0xffffffffffffffb8);
              if (iVar1 == 0) {
                amqpvalue_destroy((AMQP_VALUE)name);
                if (item_value._4_4_ < 2) {
                  attach_instance._4_4_ = 0xe54;
                }
                else {
                  name = (char *)amqpvalue_get_list_item(pAStack_30,1);
                  if ((AMQP_VALUE)name == (AMQP_VALUE)0x0) {
                    attach_destroy(*ppAStack_18);
                    attach_instance._4_4_ = 0xe36;
                  }
                  else {
                    AVar2 = amqpvalue_get_type((AMQP_VALUE)name);
                    if (AVar2 == AMQP_TYPE_NULL) {
                      amqpvalue_destroy((AMQP_VALUE)name);
                      attach_destroy(*ppAStack_18);
                      attach_instance._4_4_ = 0xe40;
                    }
                    else {
                      iVar1 = amqpvalue_get_uint((AMQP_VALUE)name,(uint32_t *)((long)&unsettled + 4)
                                                );
                      if (iVar1 == 0) {
                        amqpvalue_destroy((AMQP_VALUE)name);
                        if (item_value._4_4_ < 3) {
                          attach_instance._4_4_ = 0xe7d;
                        }
                        else {
                          name = (char *)amqpvalue_get_list_item(pAStack_30,2);
                          if ((AMQP_VALUE)name == (AMQP_VALUE)0x0) {
                            attach_destroy(*ppAStack_18);
                            attach_instance._4_4_ = 0xe5f;
                          }
                          else {
                            AVar2 = amqpvalue_get_type((AMQP_VALUE)name);
                            if (AVar2 == AMQP_TYPE_NULL) {
                              amqpvalue_destroy((AMQP_VALUE)name);
                              attach_destroy(*ppAStack_18);
                              attach_instance._4_4_ = 0xe69;
                            }
                            else {
                              iVar1 = amqpvalue_get_boolean
                                                ((AMQP_VALUE)name,(_Bool *)((long)&unsettled + 3));
                              if (iVar1 == 0) {
                                amqpvalue_destroy((AMQP_VALUE)name);
                                if ((3 < item_value._4_4_) &&
                                   (name = (char *)amqpvalue_get_list_item(pAStack_30,3),
                                   (AMQP_VALUE)name != (AMQP_VALUE)0x0)) {
                                  AVar2 = amqpvalue_get_type((AMQP_VALUE)name);
                                  if ((AVar2 != AMQP_TYPE_NULL) &&
                                     (iVar1 = amqpvalue_get_ubyte((AMQP_VALUE)name,
                                                                  (uchar *)((long)&unsettled + 2)),
                                     iVar1 != 0)) {
                                    amqpvalue_destroy((AMQP_VALUE)name);
                                    attach_destroy(*ppAStack_18);
                                    return 0xe95;
                                  }
                                  amqpvalue_destroy((AMQP_VALUE)name);
                                }
                                if ((4 < item_value._4_4_) &&
                                   (name = (char *)amqpvalue_get_list_item(pAStack_30,4),
                                   (AMQP_VALUE)name != (AMQP_VALUE)0x0)) {
                                  AVar2 = amqpvalue_get_type((AMQP_VALUE)name);
                                  if ((AVar2 != AMQP_TYPE_NULL) &&
                                     (iVar1 = amqpvalue_get_ubyte((AMQP_VALUE)name,
                                                                  (uchar *)((long)&unsettled + 1)),
                                     iVar1 != 0)) {
                                    amqpvalue_destroy((AMQP_VALUE)name);
                                    attach_destroy(*ppAStack_18);
                                    return 0xeb2;
                                  }
                                  amqpvalue_destroy((AMQP_VALUE)name);
                                }
                                if ((5 < item_value._4_4_) &&
                                   (name = (char *)amqpvalue_get_list_item(pAStack_30,5),
                                   (AMQP_VALUE)name != (AMQP_VALUE)0x0)) {
                                  amqpvalue_destroy((AMQP_VALUE)name);
                                }
                                if ((6 < item_value._4_4_) &&
                                   (name = (char *)amqpvalue_get_list_item(pAStack_30,6),
                                   (AMQP_VALUE)name != (AMQP_VALUE)0x0)) {
                                  amqpvalue_destroy((AMQP_VALUE)name);
                                }
                                if ((7 < item_value._4_4_) &&
                                   (name = (char *)amqpvalue_get_list_item(pAStack_30,7),
                                   (AMQP_VALUE)name != (AMQP_VALUE)0x0)) {
                                  AVar2 = amqpvalue_get_type((AMQP_VALUE)name);
                                  if ((AVar2 != AMQP_TYPE_NULL) &&
                                     (iVar1 = amqpvalue_get_map((AMQP_VALUE)name,
                                                                (AMQP_VALUE *)
                                                                &initial_delivery_count), iVar1 != 0
                                     )) {
                                    amqpvalue_destroy((AMQP_VALUE)name);
                                    attach_destroy(*ppAStack_18);
                                    return 0xee9;
                                  }
                                  amqpvalue_destroy((AMQP_VALUE)name);
                                }
                                if ((8 < item_value._4_4_) &&
                                   (name = (char *)amqpvalue_get_list_item(pAStack_30,8),
                                   (AMQP_VALUE)name != (AMQP_VALUE)0x0)) {
                                  AVar2 = amqpvalue_get_type((AMQP_VALUE)name);
                                  if ((AVar2 != AMQP_TYPE_NULL) &&
                                     (iVar1 = amqpvalue_get_boolean
                                                        ((AMQP_VALUE)name,
                                                         (_Bool *)((long)&max_message_size + 7)),
                                     iVar1 != 0)) {
                                    amqpvalue_destroy((AMQP_VALUE)name);
                                    attach_destroy(*ppAStack_18);
                                    return 0xf06;
                                  }
                                  amqpvalue_destroy((AMQP_VALUE)name);
                                }
                                if ((9 < item_value._4_4_) &&
                                   (name = (char *)amqpvalue_get_list_item(pAStack_30,9),
                                   (AMQP_VALUE)name != (AMQP_VALUE)0x0)) {
                                  AVar2 = amqpvalue_get_type((AMQP_VALUE)name);
                                  if ((AVar2 != AMQP_TYPE_NULL) &&
                                     (iVar1 = amqpvalue_get_uint((AMQP_VALUE)name,
                                                                 (uint32_t *)&max_message_size),
                                     iVar1 != 0)) {
                                    amqpvalue_destroy((AMQP_VALUE)name);
                                    attach_destroy(*ppAStack_18);
                                    return 0xf23;
                                  }
                                  amqpvalue_destroy((AMQP_VALUE)name);
                                }
                                if ((10 < item_value._4_4_) &&
                                   (name = (char *)amqpvalue_get_list_item(pAStack_30,10),
                                   (AMQP_VALUE)name != (AMQP_VALUE)0x0)) {
                                  AVar2 = amqpvalue_get_type((AMQP_VALUE)name);
                                  if ((AVar2 != AMQP_TYPE_NULL) &&
                                     (iVar1 = amqpvalue_get_ulong((AMQP_VALUE)name,
                                                                  (uint64_t *)&offered_capabilities)
                                     , iVar1 != 0)) {
                                    amqpvalue_destroy((AMQP_VALUE)name);
                                    attach_destroy(*ppAStack_18);
                                    return 0xf40;
                                  }
                                  amqpvalue_destroy((AMQP_VALUE)name);
                                }
                                if ((0xb < item_value._4_4_) &&
                                   (name = (char *)amqpvalue_get_list_item(pAStack_30,0xb),
                                   (AMQP_VALUE)name != (AMQP_VALUE)0x0)) {
                                  AVar2 = amqpvalue_get_type((AMQP_VALUE)name);
                                  if (AVar2 != AMQP_TYPE_NULL) {
                                    offered_capabilities_array = (AMQP_VALUE)0x0;
                                    AVar2 = amqpvalue_get_type((AMQP_VALUE)name);
                                    if (((AVar2 != AMQP_TYPE_ARRAY) ||
                                        (iVar1 = amqpvalue_get_array((AMQP_VALUE)name,
                                                                     (AMQP_VALUE *)
                                                                     &desired_capabilities),
                                        iVar1 != 0)) &&
                                       (iVar1 = amqpvalue_get_symbol
                                                          ((AMQP_VALUE)name,
                                                           (char **)&offered_capabilities_array),
                                       iVar1 != 0)) {
                                      amqpvalue_destroy((AMQP_VALUE)name);
                                      attach_destroy(*ppAStack_18);
                                      return 0xf5f;
                                    }
                                  }
                                  amqpvalue_destroy((AMQP_VALUE)name);
                                }
                                if ((0xc < item_value._4_4_) &&
                                   (name = (char *)amqpvalue_get_list_item(pAStack_30,0xc),
                                   (AMQP_VALUE)name != (AMQP_VALUE)0x0)) {
                                  AVar2 = amqpvalue_get_type((AMQP_VALUE)name);
                                  if (AVar2 != AMQP_TYPE_NULL) {
                                    desired_capabilities_array = (AMQP_VALUE)0x0;
                                    AVar2 = amqpvalue_get_type((AMQP_VALUE)name);
                                    if (((AVar2 != AMQP_TYPE_ARRAY) ||
                                        (iVar1 = amqpvalue_get_array((AMQP_VALUE)name,&properties),
                                        iVar1 != 0)) &&
                                       (iVar1 = amqpvalue_get_symbol
                                                          ((AMQP_VALUE)name,
                                                           (char **)&desired_capabilities_array),
                                       iVar1 != 0)) {
                                      amqpvalue_destroy((AMQP_VALUE)name);
                                      attach_destroy(*ppAStack_18);
                                      return 0xf7e;
                                    }
                                  }
                                  amqpvalue_destroy((AMQP_VALUE)name);
                                }
                                if ((0xd < item_value._4_4_) &&
                                   (name = (char *)amqpvalue_get_list_item(pAStack_30,0xd),
                                   (AMQP_VALUE)name != (AMQP_VALUE)0x0)) {
                                  AVar2 = amqpvalue_get_type((AMQP_VALUE)name);
                                  if ((AVar2 != AMQP_TYPE_NULL) &&
                                     (iVar1 = amqpvalue_get_map((AMQP_VALUE)name,&local_90),
                                     iVar1 != 0)) {
                                    amqpvalue_destroy((AMQP_VALUE)name);
                                    attach_destroy(*ppAStack_18);
                                    return 0xf9b;
                                  }
                                  amqpvalue_destroy((AMQP_VALUE)name);
                                }
                                pAVar3 = amqpvalue_clone((AMQP_VALUE)attach_handle_local);
                                *(AMQP_VALUE *)list_value = pAVar3;
                                attach_instance._4_4_ = 0;
                              }
                              else {
                                amqpvalue_destroy((AMQP_VALUE)name);
                                attach_destroy(*ppAStack_18);
                                attach_instance._4_4_ = 0xe73;
                              }
                            }
                          }
                        }
                      }
                      else {
                        amqpvalue_destroy((AMQP_VALUE)name);
                        attach_destroy(*ppAStack_18);
                        attach_instance._4_4_ = 0xe4a;
                      }
                    }
                  }
                }
              }
              else {
                amqpvalue_destroy((AMQP_VALUE)name);
                attach_destroy(*ppAStack_18);
                attach_instance._4_4_ = 0xe21;
              }
            }
          }
        }
      }
      else {
        attach_instance._4_4_ = 0xdfe;
      }
    }
  }
  return attach_instance._4_4_;
}

Assistant:

int amqpvalue_get_attach(AMQP_VALUE value, ATTACH_HANDLE* attach_handle)
{
    int result;
    ATTACH_INSTANCE* attach_instance = (ATTACH_INSTANCE*)attach_create_internal();
    *attach_handle = attach_instance;
    if (*attach_handle == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        AMQP_VALUE list_value = amqpvalue_get_inplace_described_value(value);
        if (list_value == NULL)
        {
            attach_destroy(*attach_handle);
            result = MU_FAILURE;
        }
        else
        {
            uint32_t list_item_count;
            if (amqpvalue_get_list_item_count(list_value, &list_item_count) != 0)
            {
                result = MU_FAILURE;
            }
            else
            {
                do
                {
                    AMQP_VALUE item_value;
                    /* name */
                    if (list_item_count > 0)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 0);
                        if (item_value == NULL)
                        {
                            {
                                attach_destroy(*attach_handle);
                                result = MU_FAILURE;
                                break;
                            }
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                amqpvalue_destroy(item_value);
                                attach_destroy(*attach_handle);
                                result = MU_FAILURE;
                                break;
                            }
                            else
                            {
                                const char* name;
                                if (amqpvalue_get_string(item_value, &name) != 0)
                                {
                                    amqpvalue_destroy(item_value);
                                    attach_destroy(*attach_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }
                    else
                    {
                        result = MU_FAILURE;
                        break;
                    }
                    /* handle */
                    if (list_item_count > 1)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 1);
                        if (item_value == NULL)
                        {
                            {
                                attach_destroy(*attach_handle);
                                result = MU_FAILURE;
                                break;
                            }
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                amqpvalue_destroy(item_value);
                                attach_destroy(*attach_handle);
                                result = MU_FAILURE;
                                break;
                            }
                            else
                            {
                                handle handle;
                                if (amqpvalue_get_handle(item_value, &handle) != 0)
                                {
                                    amqpvalue_destroy(item_value);
                                    attach_destroy(*attach_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }
                    else
                    {
                        result = MU_FAILURE;
                        break;
                    }
                    /* role */
                    if (list_item_count > 2)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 2);
                        if (item_value == NULL)
                        {
                            {
                                attach_destroy(*attach_handle);
                                result = MU_FAILURE;
                                break;
                            }
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                amqpvalue_destroy(item_value);
                                attach_destroy(*attach_handle);
                                result = MU_FAILURE;
                                break;
                            }
                            else
                            {
                                role role;
                                if (amqpvalue_get_role(item_value, &role) != 0)
                                {
                                    amqpvalue_destroy(item_value);
                                    attach_destroy(*attach_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }
                    else
                    {
                        result = MU_FAILURE;
                        break;
                    }
                    /* snd-settle-mode */
                    if (list_item_count > 3)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 3);
                        if (item_value == NULL)
                        {
                            /* do nothing */
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                /* no error, field is not mandatory */
                            }
                            else
                            {
                                sender_settle_mode snd_settle_mode;
                                if (amqpvalue_get_sender_settle_mode(item_value, &snd_settle_mode) != 0)
                                {
                                    amqpvalue_destroy(item_value);
                                    attach_destroy(*attach_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }
                    /* rcv-settle-mode */
                    if (list_item_count > 4)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 4);
                        if (item_value == NULL)
                        {
                            /* do nothing */
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                /* no error, field is not mandatory */
                            }
                            else
                            {
                                receiver_settle_mode rcv_settle_mode;
                                if (amqpvalue_get_receiver_settle_mode(item_value, &rcv_settle_mode) != 0)
                                {
                                    amqpvalue_destroy(item_value);
                                    attach_destroy(*attach_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }
                    /* source */
                    if (list_item_count > 5)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 5);
                        if (item_value == NULL)
                        {
                            /* do nothing */
                        }
                        else
                        {
                            amqpvalue_destroy(item_value);
                        }
                    }
                    /* target */
                    if (list_item_count > 6)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 6);
                        if (item_value == NULL)
                        {
                            /* do nothing */
                        }
                        else
                        {
                            amqpvalue_destroy(item_value);
                        }
                    }
                    /* unsettled */
                    if (list_item_count > 7)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 7);
                        if (item_value == NULL)
                        {
                            /* do nothing */
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                /* no error, field is not mandatory */
                            }
                            else
                            {
                                AMQP_VALUE unsettled;
                                if (amqpvalue_get_map(item_value, &unsettled) != 0)
                                {
                                    amqpvalue_destroy(item_value);
                                    attach_destroy(*attach_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }
                    /* incomplete-unsettled */
                    if (list_item_count > 8)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 8);
                        if (item_value == NULL)
                        {
                            /* do nothing */
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                /* no error, field is not mandatory */
                            }
                            else
                            {
                                bool incomplete_unsettled;
                                if (amqpvalue_get_boolean(item_value, &incomplete_unsettled) != 0)
                                {
                                    amqpvalue_destroy(item_value);
                                    attach_destroy(*attach_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }
                    /* initial-delivery-count */
                    if (list_item_count > 9)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 9);
                        if (item_value == NULL)
                        {
                            /* do nothing */
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                /* no error, field is not mandatory */
                            }
                            else
                            {
                                sequence_no initial_delivery_count;
                                if (amqpvalue_get_sequence_no(item_value, &initial_delivery_count) != 0)
                                {
                                    amqpvalue_destroy(item_value);
                                    attach_destroy(*attach_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }
                    /* max-message-size */
                    if (list_item_count > 10)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 10);
                        if (item_value == NULL)
                        {
                            /* do nothing */
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                /* no error, field is not mandatory */
                            }
                            else
                            {
                                uint64_t max_message_size;
                                if (amqpvalue_get_ulong(item_value, &max_message_size) != 0)
                                {
                                    amqpvalue_destroy(item_value);
                                    attach_destroy(*attach_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }
                    /* offered-capabilities */
                    if (list_item_count > 11)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 11);
                        if (item_value == NULL)
                        {
                            /* do nothing */
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                /* no error, field is not mandatory */
                            }
                            else
                            {
                                const char* offered_capabilities = NULL;
                                AMQP_VALUE offered_capabilities_array;
                                if (((amqpvalue_get_type(item_value) != AMQP_TYPE_ARRAY) || (amqpvalue_get_array(item_value, &offered_capabilities_array) != 0)) &&
                                    (amqpvalue_get_symbol(item_value, &offered_capabilities) != 0))
                                {
                                    amqpvalue_destroy(item_value);
                                    attach_destroy(*attach_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }
                    /* desired-capabilities */
                    if (list_item_count > 12)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 12);
                        if (item_value == NULL)
                        {
                            /* do nothing */
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                /* no error, field is not mandatory */
                            }
                            else
                            {
                                const char* desired_capabilities = NULL;
                                AMQP_VALUE desired_capabilities_array;
                                if (((amqpvalue_get_type(item_value) != AMQP_TYPE_ARRAY) || (amqpvalue_get_array(item_value, &desired_capabilities_array) != 0)) &&
                                    (amqpvalue_get_symbol(item_value, &desired_capabilities) != 0))
                                {
                                    amqpvalue_destroy(item_value);
                                    attach_destroy(*attach_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }
                    /* properties */
                    if (list_item_count > 13)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 13);
                        if (item_value == NULL)
                        {
                            /* do nothing */
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                /* no error, field is not mandatory */
                            }
                            else
                            {
                                fields properties;
                                if (amqpvalue_get_fields(item_value, &properties) != 0)
                                {
                                    amqpvalue_destroy(item_value);
                                    attach_destroy(*attach_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }

                    attach_instance->composite_value = amqpvalue_clone(value);

                    result = 0;
                } while(0);
            }
        }
    }

    return result;
}